

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void filter_vert_w16_ssse3(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,int16_t *filter,int w)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int16_t *in_RCX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i temp_hi;
  __m128i temp_lo;
  __m128i s_hi [4];
  __m128i s_lo [4];
  __m128i s [8];
  __m128i f [4];
  int i;
  ptrdiff_t in_stack_fffffffffffffd38;
  uint8_t *in_stack_fffffffffffffd40;
  undefined1 local_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  undefined1 uStack_2a5;
  undefined1 uStack_2a4;
  undefined1 uStack_2a3;
  undefined1 uStack_2a2;
  undefined1 uStack_2a1;
  undefined1 uStack_2a0;
  undefined1 uStack_29f;
  undefined1 uStack_29e;
  undefined1 uStack_29d;
  undefined1 uStack_29c;
  undefined1 uStack_29b;
  undefined1 uStack_29a;
  undefined1 uStack_299;
  undefined1 local_298;
  undefined1 uStack_297;
  undefined1 uStack_296;
  undefined1 uStack_295;
  undefined1 uStack_294;
  undefined1 uStack_293;
  undefined1 uStack_292;
  undefined1 uStack_291;
  undefined1 uStack_290;
  undefined1 uStack_28f;
  undefined1 uStack_28e;
  undefined1 uStack_28d;
  undefined1 uStack_28c;
  undefined1 uStack_28b;
  undefined1 uStack_28a;
  undefined1 uStack_289;
  undefined1 local_288;
  undefined1 uStack_287;
  undefined1 uStack_286;
  undefined1 uStack_285;
  undefined1 uStack_284;
  undefined1 uStack_283;
  undefined1 uStack_282;
  undefined1 uStack_281;
  undefined1 uStack_280;
  undefined1 uStack_27f;
  undefined1 uStack_27e;
  undefined1 uStack_27d;
  undefined1 uStack_27c;
  undefined1 uStack_27b;
  undefined1 uStack_27a;
  undefined1 uStack_279;
  undefined1 local_278;
  undefined1 uStack_277;
  undefined1 uStack_276;
  undefined1 uStack_275;
  undefined1 uStack_274;
  undefined1 uStack_273;
  undefined1 uStack_272;
  undefined1 uStack_271;
  undefined1 uStack_270;
  undefined1 uStack_26f;
  undefined1 uStack_26e;
  undefined1 uStack_26d;
  undefined1 uStack_26c;
  undefined1 uStack_26b;
  undefined1 uStack_26a;
  undefined1 uStack_269;
  undefined1 local_268;
  undefined1 uStack_267;
  undefined1 uStack_266;
  undefined1 uStack_265;
  undefined1 uStack_264;
  undefined1 uStack_263;
  undefined1 uStack_262;
  undefined1 uStack_261;
  undefined1 uStack_260;
  undefined1 uStack_25f;
  undefined1 uStack_25e;
  undefined1 uStack_25d;
  undefined1 uStack_25c;
  undefined1 uStack_25b;
  undefined1 uStack_25a;
  undefined1 uStack_259;
  undefined1 local_258;
  undefined1 uStack_257;
  undefined1 uStack_256;
  undefined1 uStack_255;
  undefined1 uStack_254;
  undefined1 uStack_253;
  undefined1 uStack_252;
  undefined1 uStack_251;
  undefined1 uStack_250;
  undefined1 uStack_24f;
  undefined1 uStack_24e;
  undefined1 uStack_24d;
  undefined1 uStack_24c;
  undefined1 uStack_24b;
  undefined1 uStack_24a;
  undefined1 uStack_249;
  undefined1 local_248;
  undefined1 uStack_247;
  undefined1 uStack_246;
  undefined1 uStack_245;
  undefined1 uStack_244;
  undefined1 uStack_243;
  undefined1 uStack_242;
  undefined1 uStack_241;
  undefined1 uStack_240;
  undefined1 uStack_23f;
  undefined1 uStack_23e;
  undefined1 uStack_23d;
  undefined1 uStack_23c;
  undefined1 uStack_23b;
  undefined1 uStack_23a;
  undefined1 uStack_239;
  undefined1 local_238;
  undefined1 uStack_237;
  undefined1 uStack_236;
  undefined1 uStack_235;
  undefined1 uStack_234;
  undefined1 uStack_233;
  undefined1 uStack_232;
  undefined1 uStack_231;
  undefined1 uStack_230;
  undefined1 uStack_22f;
  undefined1 uStack_22e;
  undefined1 uStack_22d;
  undefined1 uStack_22c;
  undefined1 uStack_22b;
  undefined1 uStack_22a;
  undefined1 uStack_229;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  longlong local_1a8 [9];
  int local_160;
  int local_15c;
  long local_150;
  long local_140;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  ptrdiff_t local_18;
  uint8_t *puStack_10;
  ptrdiff_t *local_8;
  
  local_15c = in_R8D;
  local_150 = in_RDX;
  local_140 = in_RDI;
  shuffle_filter_ssse3(in_RCX,(__m128i *)local_1a8);
  for (local_160 = 0; local_160 < local_15c; local_160 = local_160 + 0x10) {
    loadu_8bit_16x8(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(__m128i *)0x4c6830);
    local_a8 = local_228;
    uVar8 = local_a8;
    uStack_a0 = uStack_220;
    local_b8 = local_218;
    uVar7 = local_b8;
    uStack_b0 = uStack_210;
    local_a8._0_1_ = (undefined1)local_228;
    local_a8._1_1_ = (undefined1)((ulong)local_228 >> 8);
    local_a8._2_1_ = (undefined1)((ulong)local_228 >> 0x10);
    local_a8._3_1_ = (undefined1)((ulong)local_228 >> 0x18);
    local_a8._4_1_ = (undefined1)((ulong)local_228 >> 0x20);
    local_a8._5_1_ = (undefined1)((ulong)local_228 >> 0x28);
    local_a8._6_1_ = (undefined1)((ulong)local_228 >> 0x30);
    local_a8._7_1_ = (undefined1)((ulong)local_228 >> 0x38);
    local_b8._0_1_ = (undefined1)local_218;
    local_b8._1_1_ = (undefined1)((ulong)local_218 >> 8);
    local_b8._2_1_ = (undefined1)((ulong)local_218 >> 0x10);
    local_b8._3_1_ = (undefined1)((ulong)local_218 >> 0x18);
    local_b8._4_1_ = (undefined1)((ulong)local_218 >> 0x20);
    local_b8._5_1_ = (undefined1)((ulong)local_218 >> 0x28);
    local_b8._6_1_ = (undefined1)((ulong)local_218 >> 0x30);
    local_b8._7_1_ = (undefined1)((ulong)local_218 >> 0x38);
    local_268 = (undefined1)local_a8;
    uStack_267 = (undefined1)local_b8;
    uStack_266 = local_a8._1_1_;
    uStack_265 = local_b8._1_1_;
    uStack_264 = local_a8._2_1_;
    uStack_263 = local_b8._2_1_;
    uStack_262 = local_a8._3_1_;
    uStack_261 = local_b8._3_1_;
    uStack_260 = local_a8._4_1_;
    uStack_25f = local_b8._4_1_;
    uStack_25e = local_a8._5_1_;
    uStack_25d = local_b8._5_1_;
    uStack_25c = local_a8._6_1_;
    uStack_25b = local_b8._6_1_;
    uStack_25a = local_a8._7_1_;
    uStack_259 = local_b8._7_1_;
    local_28 = local_228;
    uStack_20 = uStack_220;
    uVar16 = uStack_20;
    local_38 = local_218;
    uStack_30 = uStack_210;
    uVar15 = uStack_30;
    uStack_20._0_1_ = (undefined1)uStack_220;
    uStack_20._1_1_ = (undefined1)((ulong)uStack_220 >> 8);
    uStack_20._2_1_ = (undefined1)((ulong)uStack_220 >> 0x10);
    uStack_20._3_1_ = (undefined1)((ulong)uStack_220 >> 0x18);
    uStack_20._4_1_ = (undefined1)((ulong)uStack_220 >> 0x20);
    uStack_20._5_1_ = (undefined1)((ulong)uStack_220 >> 0x28);
    uStack_20._6_1_ = (undefined1)((ulong)uStack_220 >> 0x30);
    uStack_20._7_1_ = (undefined1)((ulong)uStack_220 >> 0x38);
    uStack_30._0_1_ = (undefined1)uStack_210;
    uStack_30._1_1_ = (undefined1)((ulong)uStack_210 >> 8);
    uStack_30._2_1_ = (undefined1)((ulong)uStack_210 >> 0x10);
    uStack_30._3_1_ = (undefined1)((ulong)uStack_210 >> 0x18);
    uStack_30._4_1_ = (undefined1)((ulong)uStack_210 >> 0x20);
    uStack_30._5_1_ = (undefined1)((ulong)uStack_210 >> 0x28);
    uStack_30._6_1_ = (undefined1)((ulong)uStack_210 >> 0x30);
    uStack_30._7_1_ = (undefined1)((ulong)uStack_210 >> 0x38);
    local_2a8 = (undefined1)uStack_20;
    uStack_2a7 = (undefined1)uStack_30;
    uStack_2a6 = uStack_20._1_1_;
    uStack_2a5 = uStack_30._1_1_;
    uStack_2a4 = uStack_20._2_1_;
    uStack_2a3 = uStack_30._2_1_;
    uStack_2a2 = uStack_20._3_1_;
    uStack_2a1 = uStack_30._3_1_;
    uStack_2a0 = uStack_20._4_1_;
    uStack_29f = uStack_30._4_1_;
    uStack_29e = uStack_20._5_1_;
    uStack_29d = uStack_30._5_1_;
    uStack_29c = uStack_20._6_1_;
    uStack_29b = uStack_30._6_1_;
    uStack_29a = uStack_20._7_1_;
    uStack_299 = uStack_30._7_1_;
    local_c8 = local_208;
    uVar6 = local_c8;
    uStack_c0 = uStack_200;
    local_d8 = local_1f8;
    uVar5 = local_d8;
    uStack_d0 = uStack_1f0;
    local_c8._0_1_ = (undefined1)local_208;
    local_c8._1_1_ = (undefined1)((ulong)local_208 >> 8);
    local_c8._2_1_ = (undefined1)((ulong)local_208 >> 0x10);
    local_c8._3_1_ = (undefined1)((ulong)local_208 >> 0x18);
    local_c8._4_1_ = (undefined1)((ulong)local_208 >> 0x20);
    local_c8._5_1_ = (undefined1)((ulong)local_208 >> 0x28);
    local_c8._6_1_ = (undefined1)((ulong)local_208 >> 0x30);
    local_c8._7_1_ = (undefined1)((ulong)local_208 >> 0x38);
    local_d8._0_1_ = (undefined1)local_1f8;
    local_d8._1_1_ = (undefined1)((ulong)local_1f8 >> 8);
    local_d8._2_1_ = (undefined1)((ulong)local_1f8 >> 0x10);
    local_d8._3_1_ = (undefined1)((ulong)local_1f8 >> 0x18);
    local_d8._4_1_ = (undefined1)((ulong)local_1f8 >> 0x20);
    local_d8._5_1_ = (undefined1)((ulong)local_1f8 >> 0x28);
    local_d8._6_1_ = (undefined1)((ulong)local_1f8 >> 0x30);
    local_d8._7_1_ = (undefined1)((ulong)local_1f8 >> 0x38);
    local_258 = (undefined1)local_c8;
    uStack_257 = (undefined1)local_d8;
    uStack_256 = local_c8._1_1_;
    uStack_255 = local_d8._1_1_;
    uStack_254 = local_c8._2_1_;
    uStack_253 = local_d8._2_1_;
    uStack_252 = local_c8._3_1_;
    uStack_251 = local_d8._3_1_;
    uStack_250 = local_c8._4_1_;
    uStack_24f = local_d8._4_1_;
    uStack_24e = local_c8._5_1_;
    uStack_24d = local_d8._5_1_;
    uStack_24c = local_c8._6_1_;
    uStack_24b = local_d8._6_1_;
    uStack_24a = local_c8._7_1_;
    uStack_249 = local_d8._7_1_;
    local_48 = local_208;
    uStack_40 = uStack_200;
    uVar14 = uStack_40;
    local_58 = local_1f8;
    uStack_50 = uStack_1f0;
    uVar13 = uStack_50;
    uStack_40._0_1_ = (undefined1)uStack_200;
    uStack_40._1_1_ = (undefined1)((ulong)uStack_200 >> 8);
    uStack_40._2_1_ = (undefined1)((ulong)uStack_200 >> 0x10);
    uStack_40._3_1_ = (undefined1)((ulong)uStack_200 >> 0x18);
    uStack_40._4_1_ = (undefined1)((ulong)uStack_200 >> 0x20);
    uStack_40._5_1_ = (undefined1)((ulong)uStack_200 >> 0x28);
    uStack_40._6_1_ = (undefined1)((ulong)uStack_200 >> 0x30);
    uStack_40._7_1_ = (undefined1)((ulong)uStack_200 >> 0x38);
    uStack_50._0_1_ = (undefined1)uStack_1f0;
    uStack_50._1_1_ = (undefined1)((ulong)uStack_1f0 >> 8);
    uStack_50._2_1_ = (undefined1)((ulong)uStack_1f0 >> 0x10);
    uStack_50._3_1_ = (undefined1)((ulong)uStack_1f0 >> 0x18);
    uStack_50._4_1_ = (undefined1)((ulong)uStack_1f0 >> 0x20);
    uStack_50._5_1_ = (undefined1)((ulong)uStack_1f0 >> 0x28);
    uStack_50._6_1_ = (undefined1)((ulong)uStack_1f0 >> 0x30);
    uStack_50._7_1_ = (undefined1)((ulong)uStack_1f0 >> 0x38);
    local_298 = (undefined1)uStack_40;
    uStack_297 = (undefined1)uStack_50;
    uStack_296 = uStack_40._1_1_;
    uStack_295 = uStack_50._1_1_;
    uStack_294 = uStack_40._2_1_;
    uStack_293 = uStack_50._2_1_;
    uStack_292 = uStack_40._3_1_;
    uStack_291 = uStack_50._3_1_;
    uStack_290 = uStack_40._4_1_;
    uStack_28f = uStack_50._4_1_;
    uStack_28e = uStack_40._5_1_;
    uStack_28d = uStack_50._5_1_;
    uStack_28c = uStack_40._6_1_;
    uStack_28b = uStack_50._6_1_;
    uStack_28a = uStack_40._7_1_;
    uStack_289 = uStack_50._7_1_;
    local_e8 = local_1e8;
    uVar4 = local_e8;
    uStack_e0 = uStack_1e0;
    local_f8 = local_1d8;
    uVar3 = local_f8;
    uStack_f0 = uStack_1d0;
    local_e8._0_1_ = (undefined1)local_1e8;
    local_e8._1_1_ = (undefined1)((ulong)local_1e8 >> 8);
    local_e8._2_1_ = (undefined1)((ulong)local_1e8 >> 0x10);
    local_e8._3_1_ = (undefined1)((ulong)local_1e8 >> 0x18);
    local_e8._4_1_ = (undefined1)((ulong)local_1e8 >> 0x20);
    local_e8._5_1_ = (undefined1)((ulong)local_1e8 >> 0x28);
    local_e8._6_1_ = (undefined1)((ulong)local_1e8 >> 0x30);
    local_e8._7_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    local_f8._0_1_ = (undefined1)local_1d8;
    local_f8._1_1_ = (undefined1)((ulong)local_1d8 >> 8);
    local_f8._2_1_ = (undefined1)((ulong)local_1d8 >> 0x10);
    local_f8._3_1_ = (undefined1)((ulong)local_1d8 >> 0x18);
    local_f8._4_1_ = (undefined1)((ulong)local_1d8 >> 0x20);
    local_f8._5_1_ = (undefined1)((ulong)local_1d8 >> 0x28);
    local_f8._6_1_ = (undefined1)((ulong)local_1d8 >> 0x30);
    local_f8._7_1_ = (undefined1)((ulong)local_1d8 >> 0x38);
    local_248 = (undefined1)local_e8;
    uStack_247 = (undefined1)local_f8;
    uStack_246 = local_e8._1_1_;
    uStack_245 = local_f8._1_1_;
    uStack_244 = local_e8._2_1_;
    uStack_243 = local_f8._2_1_;
    uStack_242 = local_e8._3_1_;
    uStack_241 = local_f8._3_1_;
    uStack_240 = local_e8._4_1_;
    uStack_23f = local_f8._4_1_;
    uStack_23e = local_e8._5_1_;
    uStack_23d = local_f8._5_1_;
    uStack_23c = local_e8._6_1_;
    uStack_23b = local_f8._6_1_;
    uStack_23a = local_e8._7_1_;
    uStack_239 = local_f8._7_1_;
    local_68 = local_1e8;
    uStack_60 = uStack_1e0;
    uVar12 = uStack_60;
    local_78 = local_1d8;
    uStack_70 = uStack_1d0;
    uVar11 = uStack_70;
    uStack_60._0_1_ = (undefined1)uStack_1e0;
    uStack_60._1_1_ = (undefined1)((ulong)uStack_1e0 >> 8);
    uStack_60._2_1_ = (undefined1)((ulong)uStack_1e0 >> 0x10);
    uStack_60._3_1_ = (undefined1)((ulong)uStack_1e0 >> 0x18);
    uStack_60._4_1_ = (undefined1)((ulong)uStack_1e0 >> 0x20);
    uStack_60._5_1_ = (undefined1)((ulong)uStack_1e0 >> 0x28);
    uStack_60._6_1_ = (undefined1)((ulong)uStack_1e0 >> 0x30);
    uStack_60._7_1_ = (undefined1)((ulong)uStack_1e0 >> 0x38);
    uStack_70._0_1_ = (undefined1)uStack_1d0;
    uStack_70._1_1_ = (undefined1)((ulong)uStack_1d0 >> 8);
    uStack_70._2_1_ = (undefined1)((ulong)uStack_1d0 >> 0x10);
    uStack_70._3_1_ = (undefined1)((ulong)uStack_1d0 >> 0x18);
    uStack_70._4_1_ = (undefined1)((ulong)uStack_1d0 >> 0x20);
    uStack_70._5_1_ = (undefined1)((ulong)uStack_1d0 >> 0x28);
    uStack_70._6_1_ = (undefined1)((ulong)uStack_1d0 >> 0x30);
    uStack_70._7_1_ = (undefined1)((ulong)uStack_1d0 >> 0x38);
    local_288 = (undefined1)uStack_60;
    uStack_287 = (undefined1)uStack_70;
    uStack_286 = uStack_60._1_1_;
    uStack_285 = uStack_70._1_1_;
    uStack_284 = uStack_60._2_1_;
    uStack_283 = uStack_70._2_1_;
    uStack_282 = uStack_60._3_1_;
    uStack_281 = uStack_70._3_1_;
    uStack_280 = uStack_60._4_1_;
    uStack_27f = uStack_70._4_1_;
    uStack_27e = uStack_60._5_1_;
    uStack_27d = uStack_70._5_1_;
    uStack_27c = uStack_60._6_1_;
    uStack_27b = uStack_70._6_1_;
    uStack_27a = uStack_60._7_1_;
    uStack_279 = uStack_70._7_1_;
    local_108 = local_1c8;
    uVar2 = local_108;
    uStack_100 = uStack_1c0;
    local_118 = local_1b8;
    uVar1 = local_118;
    uStack_110 = uStack_1b0;
    local_108._0_1_ = (undefined1)local_1c8;
    local_108._1_1_ = (undefined1)((ulong)local_1c8 >> 8);
    local_108._2_1_ = (undefined1)((ulong)local_1c8 >> 0x10);
    local_108._3_1_ = (undefined1)((ulong)local_1c8 >> 0x18);
    local_108._4_1_ = (undefined1)((ulong)local_1c8 >> 0x20);
    local_108._5_1_ = (undefined1)((ulong)local_1c8 >> 0x28);
    local_108._6_1_ = (undefined1)((ulong)local_1c8 >> 0x30);
    local_108._7_1_ = (undefined1)((ulong)local_1c8 >> 0x38);
    local_118._0_1_ = (undefined1)local_1b8;
    local_118._1_1_ = (undefined1)((ulong)local_1b8 >> 8);
    local_118._2_1_ = (undefined1)((ulong)local_1b8 >> 0x10);
    local_118._3_1_ = (undefined1)((ulong)local_1b8 >> 0x18);
    local_118._4_1_ = (undefined1)((ulong)local_1b8 >> 0x20);
    local_118._5_1_ = (undefined1)((ulong)local_1b8 >> 0x28);
    local_118._6_1_ = (undefined1)((ulong)local_1b8 >> 0x30);
    local_118._7_1_ = (undefined1)((ulong)local_1b8 >> 0x38);
    local_238 = (undefined1)local_108;
    uStack_237 = (undefined1)local_118;
    uStack_236 = local_108._1_1_;
    uStack_235 = local_118._1_1_;
    uStack_234 = local_108._2_1_;
    uStack_233 = local_118._2_1_;
    uStack_232 = local_108._3_1_;
    uStack_231 = local_118._3_1_;
    uStack_230 = local_108._4_1_;
    uStack_22f = local_118._4_1_;
    uStack_22e = local_108._5_1_;
    uStack_22d = local_118._5_1_;
    uStack_22c = local_108._6_1_;
    uStack_22b = local_118._6_1_;
    uStack_22a = local_108._7_1_;
    uStack_229 = local_118._7_1_;
    local_88 = local_1c8;
    uStack_80 = uStack_1c0;
    uVar10 = uStack_80;
    local_98 = local_1b8;
    uStack_90 = uStack_1b0;
    uVar9 = uStack_90;
    uStack_80._0_1_ = (undefined1)uStack_1c0;
    uStack_80._1_1_ = (undefined1)((ulong)uStack_1c0 >> 8);
    uStack_80._2_1_ = (undefined1)((ulong)uStack_1c0 >> 0x10);
    uStack_80._3_1_ = (undefined1)((ulong)uStack_1c0 >> 0x18);
    uStack_80._4_1_ = (undefined1)((ulong)uStack_1c0 >> 0x20);
    uStack_80._5_1_ = (undefined1)((ulong)uStack_1c0 >> 0x28);
    uStack_80._6_1_ = (undefined1)((ulong)uStack_1c0 >> 0x30);
    uStack_80._7_1_ = (undefined1)((ulong)uStack_1c0 >> 0x38);
    uStack_90._0_1_ = (undefined1)uStack_1b0;
    uStack_90._1_1_ = (undefined1)((ulong)uStack_1b0 >> 8);
    uStack_90._2_1_ = (undefined1)((ulong)uStack_1b0 >> 0x10);
    uStack_90._3_1_ = (undefined1)((ulong)uStack_1b0 >> 0x18);
    uStack_90._4_1_ = (undefined1)((ulong)uStack_1b0 >> 0x20);
    uStack_90._5_1_ = (undefined1)((ulong)uStack_1b0 >> 0x28);
    uStack_90._6_1_ = (undefined1)((ulong)uStack_1b0 >> 0x30);
    uStack_90._7_1_ = (undefined1)((ulong)uStack_1b0 >> 0x38);
    local_278 = (undefined1)uStack_80;
    uStack_277 = (undefined1)uStack_90;
    uStack_276 = uStack_80._1_1_;
    uStack_275 = uStack_90._1_1_;
    uStack_274 = uStack_80._2_1_;
    uStack_273 = uStack_90._2_1_;
    uStack_272 = uStack_80._3_1_;
    uStack_271 = uStack_90._3_1_;
    uStack_270 = uStack_80._4_1_;
    uStack_26f = uStack_90._4_1_;
    uStack_26e = uStack_80._5_1_;
    uStack_26d = uStack_90._5_1_;
    uStack_26c = uStack_80._6_1_;
    uStack_26b = uStack_90._6_1_;
    uStack_26a = uStack_80._7_1_;
    uStack_269 = uStack_90._7_1_;
    local_118 = uVar1;
    local_108 = uVar2;
    local_f8 = uVar3;
    local_e8 = uVar4;
    local_d8 = uVar5;
    local_c8 = uVar6;
    local_b8 = uVar7;
    local_a8 = uVar8;
    uStack_90 = uVar9;
    uStack_80 = uVar10;
    uStack_70 = uVar11;
    uStack_60 = uVar12;
    uStack_50 = uVar13;
    uStack_40 = uVar14;
    uStack_30 = uVar15;
    uStack_20 = uVar16;
    convolve8_8_ssse3((__m128i *)&local_268,(__m128i *)local_1a8);
    convolve8_8_ssse3((__m128i *)&local_2a8,(__m128i *)local_1a8);
    local_128 = (short)extraout_XMM0_Qa;
    sStack_126 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
    sStack_124 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
    sStack_122 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
    sStack_120 = (short)extraout_XMM0_Qb;
    sStack_11e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
    sStack_11c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
    sStack_11a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
    local_138 = (short)extraout_XMM0_Qa_00;
    sStack_136 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    sStack_134 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    sStack_132 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    sStack_130 = (short)extraout_XMM0_Qb_00;
    sStack_12e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    sStack_12c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    sStack_12a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    in_stack_fffffffffffffd38 =
         CONCAT17((0 < sStack_11a) * (sStack_11a < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x30)
                  - (0xff < sStack_11a),
                  CONCAT16((0 < sStack_11c) * (sStack_11c < 0x100) *
                           (char)((ulong)extraout_XMM0_Qb >> 0x20) - (0xff < sStack_11c),
                           CONCAT15((0 < sStack_11e) * (sStack_11e < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qb >> 0x10) - (0xff < sStack_11e),
                                    CONCAT14((0 < sStack_120) * (sStack_120 < 0x100) *
                                             (char)extraout_XMM0_Qb - (0xff < sStack_120),
                                             CONCAT13((0 < sStack_122) * (sStack_122 < 0x100) *
                                                      (char)((ulong)extraout_XMM0_Qa >> 0x30) -
                                                      (0xff < sStack_122),
                                                      CONCAT12((0 < sStack_124) *
                                                               (sStack_124 < 0x100) *
                                                               (char)((ulong)extraout_XMM0_Qa >>
                                                                     0x20) - (0xff < sStack_124),
                                                               CONCAT11((0 < sStack_126) *
                                                                        (sStack_126 < 0x100) *
                                                                        (char)((ulong)
                                                  extraout_XMM0_Qa >> 0x10) - (0xff < sStack_126),
                                                  (0 < local_128) * (local_128 < 0x100) *
                                                  (char)extraout_XMM0_Qa - (0xff < local_128))))))))
    ;
    in_stack_fffffffffffffd40 =
         (uint8_t *)
         CONCAT17((0 < sStack_12a) * (sStack_12a < 0x100) *
                  (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_12a),
                  CONCAT16((0 < sStack_12c) * (sStack_12c < 0x100) *
                           (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) - (0xff < sStack_12c),
                           CONCAT15((0 < sStack_12e) * (sStack_12e < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) - (0xff < sStack_12e)
                                    ,CONCAT14((0 < sStack_130) * (sStack_130 < 0x100) *
                                              (char)extraout_XMM0_Qb_00 - (0xff < sStack_130),
                                              CONCAT13((0 < sStack_132) * (sStack_132 < 0x100) *
                                                       (char)((ulong)extraout_XMM0_Qa_00 >> 0x30) -
                                                       (0xff < sStack_132),
                                                       CONCAT12((0 < sStack_134) *
                                                                (sStack_134 < 0x100) *
                                                                (char)((ulong)extraout_XMM0_Qa_00 >>
                                                                      0x20) - (0xff < sStack_134),
                                                                CONCAT11((0 < sStack_136) *
                                                                         (sStack_136 < 0x100) *
                                                                         (char)((ulong)
                                                  extraout_XMM0_Qa_00 >> 0x10) - (0xff < sStack_136)
                                                  ,(0 < local_138) * (local_138 < 0x100) *
                                                   (char)extraout_XMM0_Qa_00 - (0xff < local_138))))
                                             ))));
    local_140 = local_140 + 0x10;
    local_8 = (ptrdiff_t *)(local_150 + local_160);
    *local_8 = in_stack_fffffffffffffd38;
    local_8[1] = (ptrdiff_t)in_stack_fffffffffffffd40;
    local_18 = in_stack_fffffffffffffd38;
    puStack_10 = in_stack_fffffffffffffd40;
  }
  return;
}

Assistant:

static void filter_vert_w16_ssse3(const uint8_t *src,
                                  const ptrdiff_t src_stride,
                                  uint8_t *const dst,
                                  const int16_t *const filter, const int w) {
  int i;
  __m128i f[4];
  shuffle_filter_ssse3(filter, f);

  for (i = 0; i < w; i += 16) {
    __m128i s[8], s_lo[4], s_hi[4], temp_lo, temp_hi;

    loadu_8bit_16x8(src, src_stride, s);

    // merge the result together
    s_lo[0] = _mm_unpacklo_epi8(s[0], s[1]);
    s_hi[0] = _mm_unpackhi_epi8(s[0], s[1]);
    s_lo[1] = _mm_unpacklo_epi8(s[2], s[3]);
    s_hi[1] = _mm_unpackhi_epi8(s[2], s[3]);
    s_lo[2] = _mm_unpacklo_epi8(s[4], s[5]);
    s_hi[2] = _mm_unpackhi_epi8(s[4], s[5]);
    s_lo[3] = _mm_unpacklo_epi8(s[6], s[7]);
    s_hi[3] = _mm_unpackhi_epi8(s[6], s[7]);
    temp_lo = convolve8_8_ssse3(s_lo, f);
    temp_hi = convolve8_8_ssse3(s_hi, f);

    // shrink to 8 bit each 16 bits, the first lane contain the first convolve
    // result and the second lane contain the second convolve result
    temp_hi = _mm_packus_epi16(temp_lo, temp_hi);
    src += 16;
    // save 16 bytes convolve result
    _mm_store_si128((__m128i *)&dst[i], temp_hi);
  }
}